

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStringConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  charcount_t cVar1;
  int iVar2;
  uint32 uVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  ByteBuffer *this_00;
  undefined4 extraout_var;
  TrackAllocData local_60;
  ByteBuffer *local_38;
  ByteBuffer *bb;
  JavascriptString *pJStack_28;
  uint32 size;
  JavascriptString *str;
  Var var_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  str = (JavascriptString *)var;
  var_local = builder;
  builder_local = (BufferBuilderList *)this;
  pJStack_28 = VarTo<Js::JavascriptString>(var);
  bb._4_4_ = 0;
  pAVar4 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&ByteBuffer::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0x5ca);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_60);
  this_00 = (ByteBuffer *)new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar4,0x3f67b0);
  cVar1 = JavascriptString::GetLength(pJStack_28);
  iVar2 = (*(pJStack_28->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
  ByteBuffer::ByteBuffer(this_00,(cVar1 + 1) * 2,(void *)CONCAT44(extraout_var,iVar2));
  local_38 = this_00;
  uVar3 = PrependByteBuffer(this,(BufferBuilderList *)var_local,L"String Constant 16 Value",this_00)
  ;
  return uVar3 + bb._4_4_;
}

Assistant:

uint32 PrependStringConstant(BufferBuilderList & builder, Var var)
    {
        auto str = VarTo<JavascriptString>(var);
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start String Constant"), magicStartStringConstant);
#endif
        auto bb = Anew(alloc, ByteBuffer, (str->GetLength() + 1) * sizeof(char16), (void*)str->GetSz());
        size += PrependByteBuffer(builder, _u("String Constant 16 Value"), bb);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End String Constant"), magicEndStringConstant);
#endif

        return size;
    }